

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPrintDsd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint *puVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *vTruth;
  word *pInit;
  long lVar9;
  word wVar10;
  char *pcVar11;
  int iVar12;
  word *pTruthW;
  char *pcVar13;
  uint local_40;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar4 = false;
  Extra_UtilGetoptReset();
  local_40 = 1;
  bVar6 = false;
  bVar5 = false;
  while( true ) {
    while( true ) {
      while (iVar7 = Extra_UtilGetopt(argc,argv,"Npcdh"), iVar12 = globalUtilOptind, iVar7 == 99) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      if (iVar7 < 100) break;
      if (iVar7 == 100) {
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else {
        if (iVar7 != 0x70) goto LAB_001fb031;
        bVar6 = (bool)(bVar6 ^ 1);
      }
    }
    if (iVar7 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar11 = "Empty network.\n";
      }
      else if (pNtk->ntkType == ABC_NTK_LOGIC) {
        Abc_NtkToAig(pNtk);
        if (pNtk->vPos->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        plVar2 = (long *)*pNtk->vPos->pArray;
        lVar3 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        if ((*(uint *)(lVar3 + 0x14) & 0xf) == 7) {
          if (*(int *)(lVar3 + 0x1c) < 0x11) {
            vTruth = (Vec_Int_t *)malloc(0x10);
            vTruth->nCap = 0;
            vTruth->nSize = 0;
            vTruth->pArray = (int *)0x0;
            pInit = (word *)Hop_ManConvertAigToTruth
                                      ((Hop_Man_t *)pNtk->pManFunc,
                                       (Hop_Obj_t *)(*(ulong *)(lVar3 + 0x38) & 0xfffffffffffffffe),
                                       *(int *)(lVar3 + 0x1c),vTruth,0);
            if ((*(byte *)(lVar3 + 0x38) & 1) != 0) {
              uVar8 = 1 << ((char)*(int *)(lVar3 + 0x1c) - 5U & 0x1f);
              if (*(int *)(lVar3 + 0x1c) < 6) {
                uVar8 = 1;
              }
              if (0 < (int)uVar8) {
                lVar9 = (ulong)uVar8 + 1;
                do {
                  puVar1 = (uint *)((long)pInit + lVar9 * 4 + -8);
                  *puVar1 = ~*puVar1;
                  lVar9 = lVar9 + -1;
                } while (1 < lVar9);
              }
            }
            if (bVar4) {
              if (*(int *)(lVar3 + 0x1c) < 6) {
                wVar10 = Abc_Tt6Stretch(*pInit,*(int *)(lVar3 + 0x1c));
                *pInit = wVar10;
              }
              Dau_DecTrySets(pInit,*(int *)(lVar3 + 0x1c),1);
            }
            if (bVar6) {
              Kit_TruthPrintProfile((uint *)pInit,*(int *)(lVar3 + 0x1c));
            }
            else if (bVar5) {
              Kit_DsdPrintCofactors((uint *)pInit,*(int *)(lVar3 + 0x1c),local_40,1);
            }
            else {
              Kit_DsdTest((uint *)pInit,*(int *)(lVar3 + 0x1c));
            }
            if (vTruth->pArray != (int *)0x0) {
              free(vTruth->pArray);
              vTruth->pArray = (int *)0x0;
            }
            free(vTruth);
            return 0;
          }
          pcVar11 = "Currently works only for up to 16 inputs.\n";
        }
        else {
          pcVar11 = "The fanin of the first PO node does not have a logic function.\n";
        }
      }
      else {
        pcVar11 = "Currently works only for logic networks.\n";
      }
      iVar12 = -1;
      goto LAB_001fb0e0;
    }
    if (iVar7 != 0x4e) goto LAB_001fb031;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar12 + 1;
    if ((int)local_40 < 0) {
LAB_001fb031:
      Abc_Print(-2,"usage: print_dsd [-pcdh] [-N <num>]\n");
      Abc_Print(-2,
                "\t           print DSD formula for a single-output function with less than 16 variables\n"
               );
      pcVar13 = "yes";
      pcVar11 = "yes";
      if (!bVar6) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-p       : toggle printing profile [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (!bVar5) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-c       : toggle recursive cofactoring [default = %s]\n",pcVar11);
      if (!bVar4) {
        pcVar13 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle printing decompositions [default = %s]\n",pcVar13);
      Abc_Print(-2,"\t-N <num> : the number of levels to cofactor [default = %d]\n",(ulong)local_40)
      ;
      pcVar11 = "\t-h       : print the command usage\n";
      iVar12 = -2;
LAB_001fb0e0:
      Abc_Print(iVar12,pcVar11);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_001fb031;
}

Assistant:

int Abc_CommandPrintDsd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fCofactor;
    int nCofLevel;
    int fProfile;
    int fPrintDec;

    extern void Kit_DsdTest( unsigned * pTruth, int nVars );
    extern void Kit_DsdPrintCofactors( unsigned * pTruth, int nVars, int nCofLevel, int fVerbose );
    extern void Dau_DecTrySets( word * p, int nVars, int fVerbose );

    // set defaults
    nCofLevel = 1;
    fCofactor = 0;
    fProfile  = 0;
    fPrintDec = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Npcdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofLevel < 0 )
                goto usage;
            break;
        case 'p':
            fProfile ^= 1;
            break;
        case 'c':
            fCofactor ^= 1;
            break;
        case 'd':
            fPrintDec ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // get the truth table of the first output
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Currently works only for logic networks.\n" );
        return 1;
    }
    Abc_NtkToAig( pNtk );
    // convert it to truth table
    {
        Abc_Obj_t * pObj = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        Vec_Int_t * vMemory;
        unsigned * pTruth;
        if ( !Abc_ObjIsNode(pObj) )
        {
            Abc_Print( -1, "The fanin of the first PO node does not have a logic function.\n" );
            return 1;
        }
        if ( Abc_ObjFaninNum(pObj) > 16 )
        {
            Abc_Print( -1, "Currently works only for up to 16 inputs.\n" );
            return 1;
        }
        vMemory = Vec_IntAlloc(0);
        pTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, Hop_Regular((Hop_Obj_t *)pObj->pData), Abc_ObjFaninNum(pObj), vMemory, 0 );
        if ( Hop_IsComplement((Hop_Obj_t *)pObj->pData) )
            Extra_TruthNot( pTruth, pTruth, Abc_ObjFaninNum(pObj) );
//        Extra_PrintBinary( stdout, pTruth, 1 << Abc_ObjFaninNum(pObj) );
//        Abc_Print( -1, "\n" );
        if ( fPrintDec )//&&Abc_ObjFaninNum(pObj) <= 6 )
        {
            word * pTruthW = (word *)pTruth;
            if ( Abc_ObjFaninNum(pObj) < 6 )
                pTruthW[0] = Abc_Tt6Stretch( pTruthW[0], Abc_ObjFaninNum(pObj) );
            Dau_DecTrySets( (word *)pTruth, Abc_ObjFaninNum(pObj), 1 );
        }
        if ( fProfile )
            Kit_TruthPrintProfile( pTruth, Abc_ObjFaninNum(pObj) );
        else if ( fCofactor )
            Kit_DsdPrintCofactors( pTruth, Abc_ObjFaninNum(pObj), nCofLevel, 1 );
        else
            Kit_DsdTest( pTruth, Abc_ObjFaninNum(pObj) );
        Vec_IntFree( vMemory );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_dsd [-pcdh] [-N <num>]\n" );
    Abc_Print( -2, "\t           print DSD formula for a single-output function with less than 16 variables\n" );
    Abc_Print( -2, "\t-p       : toggle printing profile [default = %s]\n", fProfile? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle recursive cofactoring [default = %s]\n", fCofactor? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggle printing decompositions [default = %s]\n", fPrintDec? "yes": "no" );
    Abc_Print( -2, "\t-N <num> : the number of levels to cofactor [default = %d]\n", nCofLevel );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}